

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv__udp_bind(uv_udp_t *handle,sockaddr *addr,uint addrlen,uint flags)

{
  int iVar1;
  int *piVar2;
  int local_34;
  undefined4 local_30;
  int fd;
  int yes;
  int err;
  uint flags_local;
  uint addrlen_local;
  sockaddr *addr_local;
  uv_udp_t *handle_local;
  
  if ((flags & 0xffffffda) == 0) {
    if (((flags & 1) == 0) || (addr->sa_family == 10)) {
      local_34 = (handle->io_watcher).fd;
      yes = flags;
      err = addrlen;
      _flags_local = addr;
      addr_local = (sockaddr *)handle;
      if (local_34 == -1) {
        local_34 = uv__socket((uint)addr->sa_family,2,0);
        if (local_34 < 0) {
          return local_34;
        }
        addr_local[0xb].sa_family = (short)local_34;
        addr_local[0xb].sa_data[0] = (char)((uint)local_34 >> 0x10);
        addr_local[0xb].sa_data[1] = (char)((uint)local_34 >> 0x18);
        fd = local_34;
      }
      if ((yes & 0x20U) != 0) {
        iVar1 = uv__set_recverr(local_34,_flags_local->sa_family);
        if (iVar1 != 0) {
          return iVar1;
        }
        fd = 0;
      }
      if ((yes & 4U) != 0) {
        iVar1 = uv__set_reuse(local_34);
        if (iVar1 != 0) {
          return iVar1;
        }
        fd = 0;
      }
      if ((yes & 1U) != 0) {
        local_30 = 1;
        iVar1 = setsockopt(local_34,0x29,0x1a,&local_30,4);
        if (iVar1 == -1) {
          piVar2 = __errno_location();
          return -*piVar2;
        }
      }
      iVar1 = bind(local_34,(sockaddr *)_flags_local,err);
      if (iVar1 == 0) {
        if (((sockaddr *)_flags_local)->sa_family == 10) {
          *(uint *)(addr_local[5].sa_data + 6) = *(uint *)(addr_local[5].sa_data + 6) | 0x400000;
        }
        *(uint *)(addr_local[5].sa_data + 6) = *(uint *)(addr_local[5].sa_data + 6) | 0x2000;
        handle_local._4_4_ = 0;
      }
      else {
        piVar2 = __errno_location();
        fd = -*piVar2;
        piVar2 = __errno_location();
        if (*piVar2 == 0x61) {
          fd = -0x16;
        }
        handle_local._4_4_ = fd;
      }
    }
    else {
      handle_local._4_4_ = -0x16;
    }
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv__udp_bind(uv_udp_t* handle,
                 const struct sockaddr* addr,
                 unsigned int addrlen,
                 unsigned int flags) {
  int err;
  int yes;
  int fd;

  /* Check for bad flags. */
  if (flags & ~(UV_UDP_IPV6ONLY | UV_UDP_REUSEADDR | UV_UDP_LINUX_RECVERR))
    return UV_EINVAL;

  /* Cannot set IPv6-only mode on non-IPv6 socket. */
  if ((flags & UV_UDP_IPV6ONLY) && addr->sa_family != AF_INET6)
    return UV_EINVAL;

  fd = handle->io_watcher.fd;
  if (fd == -1) {
    err = uv__socket(addr->sa_family, SOCK_DGRAM, 0);
    if (err < 0)
      return err;
    fd = err;
    handle->io_watcher.fd = fd;
  }

  if (flags & UV_UDP_LINUX_RECVERR) {
    err = uv__set_recverr(fd, addr->sa_family);
    if (err)
      return err;
  }

  if (flags & UV_UDP_REUSEADDR) {
    err = uv__set_reuse(fd);
    if (err)
      return err;
  }

  if (flags & UV_UDP_IPV6ONLY) {
#ifdef IPV6_V6ONLY
    yes = 1;
    if (setsockopt(fd, IPPROTO_IPV6, IPV6_V6ONLY, &yes, sizeof yes) == -1) {
      err = UV__ERR(errno);
      return err;
    }
#else
    err = UV_ENOTSUP;
    return err;
#endif
  }

  if (bind(fd, addr, addrlen)) {
    err = UV__ERR(errno);
    if (errno == EAFNOSUPPORT)
      /* OSX, other BSDs and SunoS fail with EAFNOSUPPORT when binding a
       * socket created with AF_INET to an AF_INET6 address or vice versa. */
      err = UV_EINVAL;
    return err;
  }

  if (addr->sa_family == AF_INET6)
    handle->flags |= UV_HANDLE_IPV6;

  handle->flags |= UV_HANDLE_BOUND;
  return 0;
}